

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_polyfills(CompilerGLSL *this,uint32_t polyfills,bool relaxed)

{
  char **ts_3;
  bool bVar1;
  long lVar2;
  undefined7 in_register_00000011;
  undefined **ppuVar3;
  long lVar4;
  long lVar5;
  char local_64;
  char *qual;
  char *suffix;
  undefined **local_50;
  Polyfill (*local_48) [3];
  long local_40;
  char *type;
  
  qual = "";
  bVar1 = (this->options).es;
  suffix = "MP";
  if ((int)CONCAT71(in_register_00000011,relaxed) == 0) {
    suffix = "";
  }
  if (bVar1 == false) {
    suffix = "";
  }
  if ((bVar1 == true) && (qual = "highp ", relaxed)) {
    qual = "mediump ";
  }
  if ((polyfills & 1) != 0) {
    statement<char_const*&,char_const(&)[18],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [18])"mat2 spvTranspose",&suffix,(char (*) [2])0x40a721,&qual,
               (char (*) [8])"mat2 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const(&)[49]>
              (this,(char (*) [49])"return mat2(m[0][0], m[1][0], m[0][1], m[1][1]);");
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((polyfills & 2) != 0) {
    statement<char_const*&,char_const(&)[18],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [18])"mat3 spvTranspose",&suffix,(char (*) [2])0x40a721,&qual,
               (char (*) [8])"mat3 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const(&)[94]>
              (this,(char (*) [94])
                    "return mat3(m[0][0], m[1][0], m[2][0], m[0][1], m[1][1], m[2][1], m[0][2], m[1][2], m[2][2]);"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((polyfills & 4) != 0) {
    statement<char_const*&,char_const(&)[18],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [18])"mat4 spvTranspose",&suffix,(char (*) [2])0x40a721,&qual,
               (char (*) [8])"mat4 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const(&)[157]>
              (this,(char (*) [157])
                    "return mat4(m[0][0], m[1][0], m[2][0], m[3][0], m[0][1], m[1][1], m[2][1], m[3][1], m[0][2], m[1][2], m[2][2], m[3][2], m[0][3], m[1][3], m[2][3], m[3][3]);"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((polyfills & 8) != 0) {
    statement<char_const*&,char_const(&)[21],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [21])"float spvDeterminant",&suffix,(char (*) [2])0x40a721,&qual
               ,(char (*) [8])"mat2 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const(&)[46]>
              (this,(char (*) [46])"return m[0][0] * m[1][1] - m[0][1] * m[1][0];");
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((polyfills & 0x10) != 0) {
    statement<char_const*&,char_const(&)[21],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [21])"float spvDeterminant",&suffix,(char (*) [2])0x40a721,&qual
               ,(char (*) [8])"mat3 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const(&)[141]>
              (this,(char (*) [141])
                    "return dot(m[0], vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], m[1][2] * m[2][0] - m[1][0] * m[2][2], m[1][0] * m[2][1] - m[1][1] * m[2][0]));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((polyfills & 0x20) != 0) {
    statement<char_const*&,char_const(&)[21],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [21])"float spvDeterminant",&suffix,(char (*) [2])0x40a721,&qual
               ,(char (*) [8])"mat4 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const(&)[740]>
              (this,(char (*) [740])
                    "return dot(m[0], vec4(m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((polyfills & 0x40) != 0) {
    statement<char_const*&,char_const(&)[16],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [16])"mat2 spvInverse",&suffix,(char (*) [2])0x40a721,&qual,
               (char (*) [8])"mat2 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const(&)[101]>
              (this,(char (*) [101])
                    "return mat2(m[1][1], -m[0][1], -m[1][0], m[0][0]) * (1.0 / (m[0][0] * m[1][1] - m[1][0] * m[0][1]));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  local_64 = (char)polyfills;
  if (local_64 < '\0') {
    statement<char_const*&,char_const(&)[16],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [16])"mat3 spvInverse",&suffix,(char (*) [2])0x40a721,&qual,
               (char (*) [8])"mat3 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const*&,char_const(&)[132]>
              (this,&qual,
               (char (*) [132])
               "vec3 t = vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], m[1][2] * m[2][0] - m[1][0] * m[2][2], m[1][0] * m[2][1] - m[1][1] * m[2][0]);"
              );
    statement<char_const(&)[288]>
              (this,(char (*) [288])
                    "return mat3(t[0], m[0][2] * m[2][1] - m[0][1] * m[2][2], m[0][1] * m[1][2] - m[0][2] * m[1][1], t[1], m[0][0] * m[2][2] - m[0][2] * m[2][0], m[0][2] * m[1][0] - m[0][0] * m[1][2], t[2], m[0][1] * m[2][0] - m[0][0] * m[2][1], m[0][0] * m[1][1] - m[0][1] * m[1][0]) * (1.0 / dot(m[0], t));"
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if ((polyfills >> 8 & 1) != 0) {
    statement<char_const*&,char_const(&)[16],char_const*&,char_const(&)[2],char_const*&,char_const(&)[8]>
              (this,&qual,(char (*) [16])"mat4 spvInverse",&suffix,(char (*) [2])0x40a721,&qual,
               (char (*) [8])"mat4 m)");
    statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
    this->indent = this->indent + 1;
    statement<char_const*&,char_const(&)[731]>
              (this,&qual,
               (char (*) [731])
               "vec4 t = vec4(m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]);"
              );
    statement<char_const(&)[2208]>
              (this,(char (*) [2208])
                    "return mat4(t[0], m[3][1] * m[2][2] * m[0][3] - m[2][1] * m[3][2] * m[0][3] - m[3][1] * m[0][2] * m[2][3] + m[0][1] * m[3][2] * m[2][3] + m[2][1] * m[0][2] * m[3][3] - m[0][1] * m[2][2] * m[3][3], m[1][1] * m[3][2] * m[0][3] - m[3][1] * m[1][2] * m[0][3] + m[3][1] * m[0][2] * m[1][3] - m[0][1] * m[3][2] * m[1][3] - m[1][1] * m[0][2] * m[3][3] + m[0][1] * m[1][2] * m[3][3], m[2][1] * m[1][2] * m[0][3] - m[1][1] * m[2][2] * m[0][3] - m[2][1] * m[0][2] * m[1][3] + m[0][1] * m[2][2] * m[1][3] + m[1][1] * m[0][2] * m[2][3] - m[0][1] * m[1][2] * m[2][3], t[1], m[2][0] * m[3][2] * m[0][3] - m[3][0] * m[2][2] * m[0][3] + m[3][0] * m[0][2] * m[2][3] - m[0][0] * m[3][2] * m[2][3] - m[2][0] * m[0][2] * m[3][3] + m[0][0] * m[2][2] * m[3][3], m[3][0] * m[1][2] * m[0][3] - m[1][0] * m[3][2] * m[0][3] - m[3][0] * m[0][2] * m[1][3] + m[0][0] * m[3][2] * m[1][3] + m[1][0] * m[0][2] * m[3][3] - m[0][0] * m[1][2] * m[3][3], m[1][0] * m[2][2] * m[0][3] - m[2][0] * m[1][2] * m[0][3] + m[2][0] * m[0][2] * m[1][3] - m[0][0] * m[2][2] * m[1][3] - m[1][0] * m[0][2] * m[2][3] + m[0][0] * m[1][2] * m[2][3], t[2], m[3][0] * m[2][1] * m[0][3] - m[2][0] * m[3][1] * m[0][3] - m[3][0] * m[0][1] * m[2][3] + m[0][0] * m[3][1] * m[2][3] + m[2][0] * m[0][1] * m[3][3] - m[0][0] * m[2][1] * m[3][3], m[1][0] * m[3][1] * m[0][3] - m[3][0] * m[1][1] * m[0][3] + m[3][0] * m[0][1] * m[1][3] - m[0][0] * m[3][1] * m[1][3] - m[1][0] * m[0][1] * m[3][3] + m[0][0] * m[1][1] * m[3][3], m[2][0] * m[1][1] * m[0][3] - m[1][0] * m[2][1] * m[0][3] - m[2][0] * m[0][1] * m[1][3] + m[0][0] * m[2][1] * m[1][3] + m[1][0] * m[0][1] * m[2][3] - m[0][0] * m[1][1] * m[2][3], t[3], m[2][0] * m[3][1] * m[0][2] - m[3][0] * m[2][1] * m[0][2] + m[3][0] * m[0][1] * m[2][2] - m[0][0] * m[3][1] * m[2][2] - m[2][0] * m[0][1] * m[3][2] + m[0][0] * m[2][1] * m[3][2], m[3][0] * m[1][1] * m[0][2] - m[1][0] * m[3][1] * m[0][2] - m[3][0] * m[0][1] * m[1][2] + m[0][0] * m[3][1] * m[1][2] + m[1][0] * m[0][1] * m[3][2] - m[0][0] * m[1][1] * m[3][2], m[1][0] * m[2][1] * m[0][2] - m[2][0] * m[1..." /* TRUNCATED STRING LITERAL */
              );
    end_scope(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
  }
  if (relaxed) {
    lVar2 = 0;
    do {
      ts_3 = emit_polyfills(unsigned_int,bool)::spv_ops + lVar2;
      local_48 = emit_polyfills::polys + lVar2;
      local_50 = &PTR_anon_var_dwarf_b92d4b_0050bc00;
      local_40 = 0;
      do {
        if (((*local_48)[local_40] & polyfills) != 0) {
          lVar4 = 0;
          do {
            type = local_50[lVar4];
            if (lVar2 == 2) {
              statement<char_const(&)[9],char_const*&,char_const(&)[2],char_const*&,char_const(&)[9],char_const(&)[9],char_const*&,char_const(&)[13],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
                        (this,(char (*) [9])0x411ed5,&type,(char (*) [2])0x3d8129,ts_3,
                         (char (*) [9])"Relaxed(",(char (*) [9])0x411ed5,&type,
                         (char (*) [13])" a, mediump ",&type,(char (*) [13])" b, mediump ",&type,
                         (char (*) [4])" c)");
              statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
              this->indent = this->indent + 1;
              statement<char_const(&)[9],char_const*&,char_const(&)[8],char_const*&,char_const(&)[11]>
                        (this,(char (*) [9])0x411ed5,&type,(char (*) [8])" res = ",ts_3,
                         (char (*) [11])"(a, b, c);");
            }
            else {
              statement<char_const(&)[9],char_const*&,char_const(&)[2],char_const*&,char_const(&)[9],char_const(&)[9],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
                        (this,(char (*) [9])0x411ed5,&type,(char (*) [2])0x3d8129,ts_3,
                         (char (*) [9])"Relaxed(",(char (*) [9])0x411ed5,&type,
                         (char (*) [13])" a, mediump ",&type,(char (*) [4])" b)");
              statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
              this->indent = this->indent + 1;
              statement<char_const(&)[9],char_const*&,char_const(&)[8],char_const*&,char_const(&)[8]>
                        (this,(char (*) [9])0x411ed5,&type,(char (*) [8])" res = ",ts_3,
                         (char (*) [8])"(a, b);");
            }
            statement<char_const(&)[12]>(this,(char (*) [12])"return res;");
            end_scope(this);
            statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
        }
        local_40 = local_40 + 1;
        local_50 = local_50 + 4;
      } while (local_40 != 3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
    lVar2 = 0;
    bVar1 = false;
    do {
      local_50 = (undefined **)(emit_polyfills::glsl_ops + lVar2);
      local_48 = emit_polyfills::polys + lVar2;
      ppuVar3 = &PTR_anon_var_dwarf_b92d4b_0050bc00;
      lVar4 = 0;
      do {
        if (((*local_48)[lVar4] & polyfills) != 0) {
          lVar5 = 0;
          local_40 = lVar4;
          do {
            type = ppuVar3[lVar5];
            if (lVar2 == 2) {
              statement<char_const(&)[46],GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
                        (this,(char (*) [46])"spirv_instruction(set = \"GLSL.std.450\", id = ",
                         (GLSLstd450 *)local_50,(char (*) [3])0x3fd36c,&type,(char (*) [2])0x3d8129,
                         emit_polyfills::spv_ops + lVar2,(char (*) [2])0x40a721,&type,
                         (char (*) [3])0x407185,&type,(char (*) [3])0x407185,&type,
                         (char (*) [3])0x414fca);
            }
            else {
              statement<char_const(&)[46],GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
                        (this,(char (*) [46])"spirv_instruction(set = \"GLSL.std.450\", id = ",
                         (GLSLstd450 *)local_50,(char (*) [3])0x3fd36c,&type,(char (*) [2])0x3d8129,
                         emit_polyfills::spv_ops + lVar2,(char (*) [2])0x40a721,&type,
                         (char (*) [3])0x407185,&type,(char (*) [3])0x414fca);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          bVar1 = true;
          lVar4 = local_40;
        }
        lVar4 = lVar4 + 1;
        ppuVar3 = ppuVar3 + 4;
      } while (lVar4 != 3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    if (bVar1) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x3edd35);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_polyfills(uint32_t polyfills, bool relaxed)
{
	const char *qual = "";
	const char *suffix = (options.es && relaxed) ? "MP" : "";
	if (options.es)
		qual = relaxed ? "mediump " : "highp ";

	if (polyfills & PolyfillTranspose2x2)
	{
		statement(qual, "mat2 spvTranspose", suffix, "(", qual, "mat2 m)");
		begin_scope();
		statement("return mat2(m[0][0], m[1][0], m[0][1], m[1][1]);");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillTranspose3x3)
	{
		statement(qual, "mat3 spvTranspose", suffix, "(", qual, "mat3 m)");
		begin_scope();
		statement("return mat3(m[0][0], m[1][0], m[2][0], m[0][1], m[1][1], m[2][1], m[0][2], m[1][2], m[2][2]);");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillTranspose4x4)
	{
		statement(qual, "mat4 spvTranspose", suffix, "(", qual, "mat4 m)");
		begin_scope();
		statement("return mat4(m[0][0], m[1][0], m[2][0], m[3][0], m[0][1], m[1][1], m[2][1], m[3][1], m[0][2], "
		          "m[1][2], m[2][2], m[3][2], m[0][3], m[1][3], m[2][3], m[3][3]);");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillDeterminant2x2)
	{
		statement(qual, "float spvDeterminant", suffix, "(", qual, "mat2 m)");
		begin_scope();
		statement("return m[0][0] * m[1][1] - m[0][1] * m[1][0];");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillDeterminant3x3)
	{
		statement(qual, "float spvDeterminant", suffix, "(", qual, "mat3 m)");
		begin_scope();
		statement("return dot(m[0], vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], "
		                                "m[1][2] * m[2][0] - m[1][0] * m[2][2], "
		                                "m[1][0] * m[2][1] - m[1][1] * m[2][0]));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillDeterminant4x4)
	{
		statement(qual, "float spvDeterminant", suffix, "(", qual, "mat4 m)");
		begin_scope();
		statement("return dot(m[0], vec4("
		          "m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], "
		          "m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], "
		          "m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], "
		          "m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillMatrixInverse2x2)
	{
		statement(qual, "mat2 spvInverse", suffix, "(", qual, "mat2 m)");
		begin_scope();
		statement("return mat2(m[1][1], -m[0][1], -m[1][0], m[0][0]) "
		          "* (1.0 / (m[0][0] * m[1][1] - m[1][0] * m[0][1]));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillMatrixInverse3x3)
	{
		statement(qual, "mat3 spvInverse", suffix, "(", qual, "mat3 m)");
		begin_scope();
		statement(qual, "vec3 t = vec3(m[1][1] * m[2][2] - m[1][2] * m[2][1], m[1][2] * m[2][0] - m[1][0] * m[2][2], m[1][0] * m[2][1] - m[1][1] * m[2][0]);");
		statement("return mat3(t[0], "
		                      "m[0][2] * m[2][1] - m[0][1] * m[2][2], "
		                      "m[0][1] * m[1][2] - m[0][2] * m[1][1], "
		                      "t[1], "
		                      "m[0][0] * m[2][2] - m[0][2] * m[2][0], "
		                      "m[0][2] * m[1][0] - m[0][0] * m[1][2], "
		                      "t[2], "
		                      "m[0][1] * m[2][0] - m[0][0] * m[2][1], "
		                      "m[0][0] * m[1][1] - m[0][1] * m[1][0]) "
		                      "* (1.0 / dot(m[0], t));");
		end_scope();
		statement("");
	}

	if (polyfills & PolyfillMatrixInverse4x4)
	{
		statement(qual, "mat4 spvInverse", suffix, "(", qual, "mat4 m)");
		begin_scope();
		statement(qual, "vec4 t = vec4("
		          "m[2][1] * m[3][2] * m[1][3] - m[3][1] * m[2][2] * m[1][3] + m[3][1] * m[1][2] * m[2][3] - m[1][1] * m[3][2] * m[2][3] - m[2][1] * m[1][2] * m[3][3] + m[1][1] * m[2][2] * m[3][3], "
		          "m[3][0] * m[2][2] * m[1][3] - m[2][0] * m[3][2] * m[1][3] - m[3][0] * m[1][2] * m[2][3] + m[1][0] * m[3][2] * m[2][3] + m[2][0] * m[1][2] * m[3][3] - m[1][0] * m[2][2] * m[3][3], "
		          "m[2][0] * m[3][1] * m[1][3] - m[3][0] * m[2][1] * m[1][3] + m[3][0] * m[1][1] * m[2][3] - m[1][0] * m[3][1] * m[2][3] - m[2][0] * m[1][1] * m[3][3] + m[1][0] * m[2][1] * m[3][3], "
		          "m[3][0] * m[2][1] * m[1][2] - m[2][0] * m[3][1] * m[1][2] - m[3][0] * m[1][1] * m[2][2] + m[1][0] * m[3][1] * m[2][2] + m[2][0] * m[1][1] * m[3][2] - m[1][0] * m[2][1] * m[3][2]);");
		statement("return mat4("
		          "t[0], "
		          "m[3][1] * m[2][2] * m[0][3] - m[2][1] * m[3][2] * m[0][3] - m[3][1] * m[0][2] * m[2][3] + m[0][1] * m[3][2] * m[2][3] + m[2][1] * m[0][2] * m[3][3] - m[0][1] * m[2][2] * m[3][3], "
		          "m[1][1] * m[3][2] * m[0][3] - m[3][1] * m[1][2] * m[0][3] + m[3][1] * m[0][2] * m[1][3] - m[0][1] * m[3][2] * m[1][3] - m[1][1] * m[0][2] * m[3][3] + m[0][1] * m[1][2] * m[3][3], "
		          "m[2][1] * m[1][2] * m[0][3] - m[1][1] * m[2][2] * m[0][3] - m[2][1] * m[0][2] * m[1][3] + m[0][1] * m[2][2] * m[1][3] + m[1][1] * m[0][2] * m[2][3] - m[0][1] * m[1][2] * m[2][3], "
		          "t[1], "
		          "m[2][0] * m[3][2] * m[0][3] - m[3][0] * m[2][2] * m[0][3] + m[3][0] * m[0][2] * m[2][3] - m[0][0] * m[3][2] * m[2][3] - m[2][0] * m[0][2] * m[3][3] + m[0][0] * m[2][2] * m[3][3], "
		          "m[3][0] * m[1][2] * m[0][3] - m[1][0] * m[3][2] * m[0][3] - m[3][0] * m[0][2] * m[1][3] + m[0][0] * m[3][2] * m[1][3] + m[1][0] * m[0][2] * m[3][3] - m[0][0] * m[1][2] * m[3][3], "
		          "m[1][0] * m[2][2] * m[0][3] - m[2][0] * m[1][2] * m[0][3] + m[2][0] * m[0][2] * m[1][3] - m[0][0] * m[2][2] * m[1][3] - m[1][0] * m[0][2] * m[2][3] + m[0][0] * m[1][2] * m[2][3], "
		          "t[2], "
		          "m[3][0] * m[2][1] * m[0][3] - m[2][0] * m[3][1] * m[0][3] - m[3][0] * m[0][1] * m[2][3] + m[0][0] * m[3][1] * m[2][3] + m[2][0] * m[0][1] * m[3][3] - m[0][0] * m[2][1] * m[3][3], "
		          "m[1][0] * m[3][1] * m[0][3] - m[3][0] * m[1][1] * m[0][3] + m[3][0] * m[0][1] * m[1][3] - m[0][0] * m[3][1] * m[1][3] - m[1][0] * m[0][1] * m[3][3] + m[0][0] * m[1][1] * m[3][3], "
		          "m[2][0] * m[1][1] * m[0][3] - m[1][0] * m[2][1] * m[0][3] - m[2][0] * m[0][1] * m[1][3] + m[0][0] * m[2][1] * m[1][3] + m[1][0] * m[0][1] * m[2][3] - m[0][0] * m[1][1] * m[2][3], "
		          "t[3], "
		          "m[2][0] * m[3][1] * m[0][2] - m[3][0] * m[2][1] * m[0][2] + m[3][0] * m[0][1] * m[2][2] - m[0][0] * m[3][1] * m[2][2] - m[2][0] * m[0][1] * m[3][2] + m[0][0] * m[2][1] * m[3][2], "
		          "m[3][0] * m[1][1] * m[0][2] - m[1][0] * m[3][1] * m[0][2] - m[3][0] * m[0][1] * m[1][2] + m[0][0] * m[3][1] * m[1][2] + m[1][0] * m[0][1] * m[3][2] - m[0][0] * m[1][1] * m[3][2], "
		          "m[1][0] * m[2][1] * m[0][2] - m[2][0] * m[1][1] * m[0][2] + m[2][0] * m[0][1] * m[1][2] - m[0][0] * m[2][1] * m[1][2] - m[1][0] * m[0][1] * m[2][2] + m[0][0] * m[1][1] * m[2][2]) "
		          "* (1.0 / dot(m[0], t));");
		end_scope();
		statement("");
	}

	if (!relaxed)
	{
		static const Polyfill polys[3][3] = {
			{ PolyfillNMin16, PolyfillNMin32, PolyfillNMin64 },
			{ PolyfillNMax16, PolyfillNMax32, PolyfillNMax64 },
			{ PolyfillNClamp16, PolyfillNClamp32, PolyfillNClamp64 },
		};

		static const GLSLstd450 glsl_ops[] = { GLSLstd450NMin, GLSLstd450NMax, GLSLstd450NClamp };
		static const char *spv_ops[] = { "spvNMin", "spvNMax", "spvNClamp" };
		bool has_poly = false;

		for (uint32_t i = 0; i < 3; i++)
		{
			for (uint32_t j = 0; j < 3; j++)
			{
				if ((polyfills & polys[i][j]) == 0)
					continue;

				const char *types[3][4] = {
					{ "float16_t", "f16vec2", "f16vec3", "f16vec4" },
					{ "float",     "vec2",    "vec3",    "vec4" },
					{ "double",    "dvec2",   "dvec3",   "dvec4" },
				};

				for (uint32_t k = 0; k < 4; k++)
				{
					auto *type = types[j][k];

					if (i < 2)
					{
						statement("spirv_instruction(set = \"GLSL.std.450\", id = ", glsl_ops[i], ") ",
						          type, " ", spv_ops[i], "(", type, ", ", type, ");");
					}
					else
					{
						statement("spirv_instruction(set = \"GLSL.std.450\", id = ", glsl_ops[i], ") ",
						          type, " ", spv_ops[i], "(", type, ", ", type, ", ", type, ");");
					}

					has_poly = true;
				}
			}
		}

		if (has_poly)
			statement("");
	}
	else
	{
		// Mediump intrinsics don't work correctly, so wrap the intrinsic in an outer shell that ensures mediump
		// propagation.

		static const Polyfill polys[3][3] = {
			{ PolyfillNMin16, PolyfillNMin32, PolyfillNMin64 },
			{ PolyfillNMax16, PolyfillNMax32, PolyfillNMax64 },
			{ PolyfillNClamp16, PolyfillNClamp32, PolyfillNClamp64 },
		};

		static const char *spv_ops[] = { "spvNMin", "spvNMax", "spvNClamp" };

		for (uint32_t i = 0; i < 3; i++)
		{
			for (uint32_t j = 0; j < 3; j++)
			{
				if ((polyfills & polys[i][j]) == 0)
					continue;

				const char *types[3][4] = {
					{ "float16_t", "f16vec2", "f16vec3", "f16vec4" },
					{ "float",     "vec2",    "vec3",    "vec4" },
					{ "double",    "dvec2",   "dvec3",   "dvec4" },
				};

				for (uint32_t k = 0; k < 4; k++)
				{
					auto *type = types[j][k];

					if (i < 2)
					{
						statement("mediump ", type, " ", spv_ops[i], "Relaxed(",
						          "mediump ", type, " a, mediump ", type, " b)");
						begin_scope();
						statement("mediump ", type, " res = ", spv_ops[i], "(a, b);");
						statement("return res;");
						end_scope();
						statement("");
					}
					else
					{
						statement("mediump ", type, " ", spv_ops[i], "Relaxed(",
						          "mediump ", type, " a, mediump ", type, " b, mediump ", type, " c)");
						begin_scope();
						statement("mediump ", type, " res = ", spv_ops[i], "(a, b, c);");
						statement("return res;");
						end_scope();
						statement("");
					}
				}
			}
		}
	}
}